

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_number
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  bool bVar1;
  uint16_t *extent_index_00;
  uint16_t write_index_00;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  State SVar5;
  element_type *peVar6;
  Atom *this_00;
  byte local_3b9;
  shared_ptr<r_comp::RepliStruct> local_340;
  string local_330 [36];
  State local_30c;
  shared_ptr<r_comp::RepliStruct> local_308;
  State local_2f4;
  int local_2f0;
  State s;
  double local_2e8;
  double num;
  locale local_2d8 [8];
  istringstream local_2d0 [8];
  istringstream stream;
  allocator local_149;
  string local_148 [37];
  byte local_123;
  byte local_122;
  allocator local_121;
  string local_120 [32];
  shared_ptr<r_comp::RepliStruct> local_100;
  shared_ptr<r_comp::RepliStruct> local_f0;
  shared_ptr<r_comp::RepliStruct> local_e0;
  Class local_d0;
  shared_ptr<r_comp::RepliStruct> local_88;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar2 = read_nil_nb(this,&local_58,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (bVar2) {
    this_local._7_1_ = 1;
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    bVar2 = read_forever_nb(this,local_78,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (bVar2) {
      this_local._7_1_ = 1;
    }
    else {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_88,node);
      write_index_00 = extent_index_local._6_2_;
      extent_index_00 = puStack_40;
      bVar4 = local_41;
      Class::Class(&local_d0,NUMBER);
      bVar2 = read_variable(this,&local_88,write_index_00,extent_index_00,(bool)(bVar4 & 1),
                            &local_d0);
      Class::~Class(&local_d0);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_88);
      if (bVar2) {
        this_local._7_1_ = 1;
      }
      else {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
        bVar2 = read_reference(this,&local_e0,extent_index_local._6_2_,puStack_40,
                               (bool)(local_41 & 1),NUMBER);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
        if (bVar2) {
          this_local._7_1_ = 1;
        }
        else {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_f0,node);
          bVar2 = read_wildcard(this,&local_f0,extent_index_local._6_2_,puStack_40,
                                (bool)(local_41 & 1));
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_f0);
          if (bVar2) {
            this_local._7_1_ = 1;
          }
          else {
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_100,node);
            bVar2 = read_tail_wildcard(this,&local_100,extent_index_local._6_2_,puStack_40,
                                       (bool)(local_41 & 1));
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_100);
            if (bVar2) {
              this_local._7_1_ = 1;
            }
            else {
              peVar6 = std::
                       __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              bVar3 = std::operator!=(&peVar6->cmd,"");
              local_122 = 0;
              local_123 = 0;
              bVar1 = false;
              bVar2 = false;
              local_3b9 = 0;
              if (bVar3) {
                peVar6 = std::
                         __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)node);
                std::allocator<char>::allocator();
                local_122 = 1;
                std::__cxx11::string::string(local_120,"0x",&local_121);
                local_123 = 1;
                bVar3 = r_code::Utils::StartsWith(&peVar6->cmd,(string *)local_120);
                local_3b9 = 0;
                if (!bVar3) {
                  peVar6 = std::
                           __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)node);
                  std::allocator<char>::allocator();
                  bVar1 = true;
                  std::__cxx11::string::string(local_148,"us",&local_149);
                  bVar2 = true;
                  bVar3 = r_code::Utils::EndsWith(&peVar6->cmd,(string *)local_148);
                  local_3b9 = bVar3 ^ 0xff;
                }
              }
              if (bVar2) {
                std::__cxx11::string::~string(local_148);
              }
              if (bVar1) {
                std::allocator<char>::~allocator((allocator<char> *)&local_149);
              }
              if ((local_123 & 1) != 0) {
                std::__cxx11::string::~string(local_120);
              }
              if ((local_122 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_121);
              }
              if ((local_3b9 & 1) != 0) {
                peVar6 = std::
                         __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)node);
                std::__cxx11::istringstream::istringstream(local_2d0,&peVar6->cmd,8);
                std::locale::locale((locale *)&num,"C");
                std::ios::imbue(local_2d8);
                std::locale::~locale(local_2d8);
                std::locale::~locale((locale *)&num);
                std::istream::operator>>((istream *)local_2d0,&local_2e8);
                bVar4 = std::ios::fail();
                if ((bVar4 & 1) == 0) {
                  if ((local_41 & 1) != 0) {
                    r_code::Atom::Float((float)local_2e8);
                    this_00 = r_code::vector<r_code::Atom>::operator[]
                                        ((vector<r_code::Atom> *)(this->current_object + 8),
                                         (ulong)extent_index_local._6_2_);
                    r_code::Atom::operator=(this_00,(Atom *)&s);
                    r_code::Atom::~Atom((Atom *)&s);
                  }
                  this_local._7_1_ = 1;
                  local_2f0 = 1;
                }
                else {
                  local_2f0 = 0;
                }
                std::__cxx11::istringstream::~istringstream(local_2d0);
                if (local_2f0 != 0) goto LAB_0019a85d;
              }
              SVar5 = save_state(this);
              local_2f4._0_3_ = SVar5._0_3_;
              std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_308,node);
              bVar2 = expression(this,&local_308,NUMBER,extent_index_local._6_2_,puStack_40,
                                 (bool)(local_41 & 1));
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_308);
              if (bVar2) {
                this_local._7_1_ = 1;
              }
              else {
                local_30c = local_2f4;
                restore_state(this,local_2f4);
                if ((p_local._7_1_ & 1) == 0) {
                  this_local._7_1_ = 0;
                }
                else {
                  std::
                  __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)node);
                  std::operator+((char *)local_330,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)
                                 " error: expected a number or an expr evaluating to a number, got: "
                                );
                  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_340,node);
                  set_error(this,local_330,&local_340);
                  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_340);
                  std::__cxx11::string::~string((string *)local_330);
                  this_local._7_1_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0019a85d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Compiler::read_number(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL
{
    if (read_nil_nb(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_forever_nb(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, NUMBER)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, NUMBER)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (node->cmd != "" && !Utils::StartsWith(node->cmd, "0x") && !Utils::EndsWith(node->cmd, "us")) { // Make sure it isn't a hex num or a timestamp
        std::istringstream stream(node->cmd);
        stream.imbue(std::locale("C"));
        double num;
        stream >> num;
        if (!stream.fail()) {
            if (write) {
                current_object->code[write_index] = Atom::Float(num);
            }
            return true;
        }
    }

    State s = save_state();

    if (expression(node, NUMBER, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a number or an expr evaluating to a number, got: " + node->cmd, node);
        return false;
    }

    return false;
}